

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O1

ReadFileResult
anon_unknown.dwarf_36f571::TestPresetExecutionShowOnlyHelper(ShowOnlyEnum *out,Value *value)

{
  bool bVar1;
  int iVar2;
  ShowOnlyEnum SVar3;
  ReadFileResult RVar4;
  String local_50;
  
  RVar4 = INVALID_PRESET;
  if ((value != (Value *)0x0) && (bVar1 = Json::Value::isString(value), bVar1)) {
    Json::Value::asString_abi_cxx11_(&local_50,value);
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    SVar3 = Human;
    if (iVar2 != 0) {
      Json::Value::asString_abi_cxx11_(&local_50,value);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (iVar2 != 0) {
        return INVALID_PRESET;
      }
      SVar3 = JsonV1;
    }
    *out = SVar3;
    RVar4 = READ_OK;
  }
  return RVar4;
}

Assistant:

ReadFileResult TestPresetExecutionShowOnlyHelper(
  TestPreset::ExecutionOptions::ShowOnlyEnum& out, const Json::Value* value)
{
  if (!value || !value->isString()) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (value->asString() == "human") {
    out = TestPreset::ExecutionOptions::ShowOnlyEnum::Human;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "json-v1") {
    out = TestPreset::ExecutionOptions::ShowOnlyEnum::JsonV1;
    return ReadFileResult::READ_OK;
  }

  return ReadFileResult::INVALID_PRESET;
}